

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  allocator<char> local_4c1;
  string local_4c0;
  int local_4a0;
  allocator<char> local_499;
  string local_498;
  allocator<char> local_471;
  string local_470;
  undefined1 local_450 [8];
  User user;
  string local_3c8;
  undefined1 local_3a8 [8];
  Airport airport;
  month_type local_348;
  year_type local_346;
  date local_344;
  pair<boost::gregorian::date,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_340;
  day_type local_312;
  month_type local_310;
  year_type local_30e;
  date local_30c;
  pair<boost::gregorian::date,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_308;
  undefined1 local_2e0 [8];
  Ticket obj3;
  month_type local_278;
  year_type local_276;
  date local_274;
  pair<boost::gregorian::date,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_270;
  day_type local_242;
  month_type local_240;
  year_type local_23e;
  date local_23c;
  pair<boost::gregorian::date,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_238;
  undefined1 local_210 [8];
  Ticket obj2;
  month_type local_1a8;
  year_type local_1a6;
  date local_1a4;
  pair<boost::gregorian::date,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1a0;
  day_type local_172;
  month_type local_170;
  year_type local_16e;
  date local_16c;
  pair<boost::gregorian::date,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_168;
  undefined1 local_140 [8];
  Ticket obj1;
  year_type local_ce;
  date local_cc;
  pair<boost::gregorian::date,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8;
  day_type local_9a;
  month_type local_98;
  year_type local_96;
  date local_94;
  pair<boost::gregorian::date,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  undefined1 local_68 [8];
  Ticket obj;
  
  boost::gregorian::greg_year::greg_year(&local_96,0x7b7);
  boost::gregorian::greg_month::greg_month(&local_98,1);
  boost::gregorian::greg_day::greg_day(&local_9a,2);
  boost::gregorian::date::date(&local_94,local_96,local_98,local_9a);
  std::
  pair<boost::gregorian::date,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[8],_true>(&local_90,&local_94,(char (*) [8])"Vietnam");
  boost::gregorian::greg_year::greg_year(&local_ce,0x7a3);
  boost::gregorian::greg_month::greg_month((greg_month *)((long)&obj1.id + 2),1);
  boost::gregorian::greg_day::greg_day((greg_day *)&obj1.id,1);
  boost::gregorian::date::date(&local_cc,local_ce,obj1.id._2_2_,obj1.id._0_2_);
  std::
  pair<boost::gregorian::date,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[19],_true>(&local_c8,&local_cc,(char (*) [19])"Sweet home Alabama");
  Ticket::Ticket((Ticket *)local_68,&local_90,&local_c8,500.0);
  std::
  pair<boost::gregorian::date,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_c8);
  std::
  pair<boost::gregorian::date,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_90);
  boost::gregorian::greg_year::greg_year(&local_16e,0x7de);
  boost::gregorian::greg_month::greg_month(&local_170,3);
  boost::gregorian::greg_day::greg_day(&local_172,10);
  boost::gregorian::date::date(&local_16c,local_16e,local_170,local_172);
  std::
  pair<boost::gregorian::date,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_true>(&local_168,&local_16c,(char (*) [6])"Minsk");
  boost::gregorian::greg_year::greg_year(&local_1a6,0x7de);
  boost::gregorian::greg_month::greg_month(&local_1a8,2);
  boost::gregorian::greg_day::greg_day((greg_day *)&obj2.field_0x5e,2);
  boost::gregorian::date::date(&local_1a4,local_1a6,local_1a8,(day_type)obj2._94_2_);
  std::
  pair<boost::gregorian::date,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[7],_true>(&local_1a0,&local_1a4,(char (*) [7])"London");
  Ticket::Ticket((Ticket *)local_140,&local_168,&local_1a0,1999.0);
  std::
  pair<boost::gregorian::date,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_1a0);
  std::
  pair<boost::gregorian::date,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_168);
  boost::gregorian::greg_year::greg_year(&local_23e,0x7de);
  boost::gregorian::greg_month::greg_month(&local_240,4);
  boost::gregorian::greg_day::greg_day(&local_242,10);
  boost::gregorian::date::date(&local_23c,local_23e,local_240,local_242);
  std::
  pair<boost::gregorian::date,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[7],_true>(&local_238,&local_23c,(char (*) [7])"Moscow");
  boost::gregorian::greg_year::greg_year(&local_276,0x7de);
  boost::gregorian::greg_month::greg_month(&local_278,4);
  boost::gregorian::greg_day::greg_day((greg_day *)&obj3.field_0x5e,2);
  boost::gregorian::date::date(&local_274,local_276,local_278,(day_type)obj3._94_2_);
  std::
  pair<boost::gregorian::date,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[10],_true>(&local_270,&local_274,(char (*) [10])"Amsterdam");
  Ticket::Ticket((Ticket *)local_210,&local_238,&local_270,1999.0);
  std::
  pair<boost::gregorian::date,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_270);
  std::
  pair<boost::gregorian::date,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_238);
  boost::gregorian::greg_year::greg_year(&local_30e,0x7de);
  boost::gregorian::greg_month::greg_month(&local_310,5);
  boost::gregorian::greg_day::greg_day(&local_312,10);
  boost::gregorian::date::date(&local_30c,local_30e,local_310,local_312);
  std::
  pair<boost::gregorian::date,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_true>(&local_308,&local_30c,(char (*) [6])"Minsk");
  boost::gregorian::greg_year::greg_year(&local_346,0x7de);
  boost::gregorian::greg_month::greg_month(&local_348,5);
  boost::gregorian::greg_day::greg_day((greg_day *)((long)&airport.name.field_2 + 0xe),3);
  boost::gregorian::date::date(&local_344,local_346,local_348,(day_type)airport.name.field_2._14_2_)
  ;
  std::
  pair<boost::gregorian::date,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[7],_true>(&local_340,&local_344,(char (*) [7])"London");
  Ticket::Ticket((Ticket *)local_2e0,&local_308,&local_340,1999.0);
  std::
  pair<boost::gregorian::date,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_340);
  std::
  pair<boost::gregorian::date,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_308);
  Airport::Airport((Airport *)local_3a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3c8,"Sheremetyevo - A.S. Pushkin international airport",
             (allocator<char> *)&user.field_0x7f);
  Airport::set_name((Airport *)local_3a8,&local_3c8);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::allocator<char>::~allocator((allocator<char> *)&user.field_0x7f);
  user.age = 2;
  Airport::set_runway_strips((Airport *)local_3a8,(uint *)&user.age);
  Airport::push_ticket((Airport *)local_3a8,(Ticket *)local_68);
  Airport::push_ticket((Airport *)local_3a8,(Ticket *)local_140);
  Airport::push_ticket((Airport *)local_3a8,(Ticket *)local_210);
  Airport::push_ticket((Airport *)local_3a8,(Ticket *)local_2e0);
  User::User((User *)local_450);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_470,"Egor",&local_471);
  User::set_first_name((User *)local_450,&local_470);
  std::__cxx11::string::~string((string *)&local_470);
  std::allocator<char>::~allocator(&local_471);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_498,"Sviridenko",&local_499);
  User::set_second_name((User *)local_450,&local_498);
  std::__cxx11::string::~string((string *)&local_498);
  std::allocator<char>::~allocator(&local_499);
  local_4a0 = 0x13;
  User::set_age((User *)local_450,&local_4a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4c0,"123123123123",&local_4c1)
  ;
  User::set_passport_id((User *)local_450,&local_4c0);
  std::__cxx11::string::~string((string *)&local_4c0);
  std::allocator<char>::~allocator(&local_4c1);
  menu((Airport *)local_3a8,(User *)local_450);
  User::~User((User *)local_450);
  Airport::~Airport((Airport *)local_3a8);
  Ticket::~Ticket((Ticket *)local_2e0);
  Ticket::~Ticket((Ticket *)local_210);
  Ticket::~Ticket((Ticket *)local_140);
  Ticket::~Ticket((Ticket *)local_68);
  return 0;
}

Assistant:

int main()
{

Ticket obj({{1975, 1, 2},"Vietnam"},{{1955,1,1},"Sweet home Alabama"},500);
Ticket obj1({{2014, 3, 10},"Minsk"},{{2014,2,2},"London"},1999);

Ticket obj2({{2014, 4, 10},"Moscow"},{{2014,4,2},"Amsterdam"},1999);
Ticket obj3({{2014, 5, 10},"Minsk"},{{2014,5,3},"London"},1999);


Airport airport;
airport.set_name("Sheremetyevo - A.S. Pushkin international airport");
airport.set_runway_strips(2);
airport.push_ticket(obj);
airport.push_ticket(obj1);
airport.push_ticket(obj2);
airport.push_ticket(obj3);


User user;
user.set_first_name("Egor");
user.set_second_name("Sviridenko");
user.set_age(19);
user.set_passport_id("123123123123"); // without correct passport id(only digits) user can't buy any tickets.
menu(airport,user);


//airport.delete_ticket(1); //cancel flight for example
/*
std::cout << "Show available tickets in the airport" << std::endl;
airport.show();
std::cout << std::endl;
std::cout << std::endl;
*/

//user.set_passport_id("12344125643AFDAFDAF"); // validation works;

/*
//user.buy_tickets(airport,1);
//user.buy_tickets(airport,2);
std::cout << "Show user's personal data" << std::endl;
user.show_info();
std::cout << std::endl;

std::cout << "Find ticket with rule example"<< std::endl;
user.find_ticket(airport,"20140502","20140512","London","Minsk");
//  "20140502","20140512" - data period, in which algorithm will search available tickets with given cities.
std::cout << "____________________" << std::endl;
user.buyuser's wallet and info_tickets(airport,4);
std::cout << "Find ticket with rule example(Already bought)"<< std::endl;
std::cout << std::endl;
std::cout << "____________________"<<std::endl;
//user.find_ticket(airport,"19520105","20000302","Sweet home Alabama","Vietnam");
std::cout <<"Showing tickets that are available in airport right now" << std::endl;
airport.show();
std::cout << std::endl;
std::cout << "Show user's information and his wallet" << std::endl;
//user.show_info();
//user.cancel_flight(); TODO in future . move back from std::list ticket pair to airport

//to_file(airport,"data.data");// works exception with regex match txt file
//to_file(airport,"data.txt");
//save_users_wallet(user,"wallet.txt");
*/
}